

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

UBool __thiscall
icu_63::OlsonTimeZone::getNextTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  short sVar1;
  TimeArrayTimeZoneRule **ppTVar2;
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimeZoneTransition *right;
  short sVar7;
  short transIdx;
  int iVar8;
  int iVar9;
  bool bVar10;
  UDate UVar11;
  UErrorCode status;
  UnicodeString toName;
  UnicodeString fromName;
  UErrorCode local_b4;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b4 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_b4);
  if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->finalZone == (SimpleTimeZone *)0x0) {
LAB_001f4058:
      ppTVar2 = this->historicRules;
      if (ppTVar2 == (TimeArrayTimeZoneRule **)0x0) goto LAB_001f3ff8;
      sVar1 = this->firstTZTransitionIdx;
      iVar8 = (short)(this->transitionCount32 + this->transitionCountPre32 +
                     this->transitionCountPost32) + -1;
      sVar7 = (short)iVar8;
      iVar9 = iVar8;
      while (transIdx = (short)iVar9, sVar1 <= sVar7) {
        iVar6 = transitionTimeInSeconds(this,transIdx);
        if (((double)iVar6 * 1000.0 < base) || (inclusive == '\0' && (double)iVar6 * 1000.0 == base)
           ) {
          if (iVar8 != transIdx) {
            this_00 = ppTVar2[this->typeMapData[(long)transIdx + 1]];
            this_01 = ppTVar2[this->typeMapData[transIdx]];
            iVar6 = transitionTimeInSeconds(this,transIdx + 1);
            local_70.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)&PTR__UnicodeString_003e5ab8;
            local_70.fUnion.fStackFields.fLengthAndFlags = 2;
            local_b0.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)&PTR__UnicodeString_003e5ab8;
            local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
            TimeZoneRule::getName(&this_01->super_TimeZoneRule,&local_70);
            TimeZoneRule::getName(&this_00->super_TimeZoneRule,&local_b0);
            if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                local_70.fUnion.fFields.fLength =
                     (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                local_b0.fUnion.fFields.fLength =
                     (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if ((((int)local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
                 (local_70.fUnion.fFields.fLength == local_b0.fUnion.fFields.fLength)) {
                UVar3 = UnicodeString::doEquals(&local_70,&local_b0,local_70.fUnion.fFields.fLength)
                ;
                bVar10 = UVar3 != '\0';
                goto LAB_001f423f;
              }
            }
            else {
              bVar10 = (bool)(local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
LAB_001f423f:
              if (bVar10 != false) {
                iVar4 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
                iVar5 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
                if (iVar4 == iVar5) {
                  iVar4 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
                  iVar5 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
                  if (iVar4 == iVar5) {
                    iVar9 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                              [0xe])((double)iVar6 * 1000.0,this,0,result);
                    UVar3 = (UBool)iVar9;
                    goto LAB_001f42bf;
                  }
                }
              }
            }
            TimeZoneTransition::setTime(result,(double)iVar6 * 1000.0);
            iVar9 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_01);
            TimeZoneTransition::adoptFrom(result,(TimeZoneRule *)CONCAT44(extraout_var,iVar9));
            iVar9 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_00);
            UVar3 = '\x01';
            TimeZoneTransition::adoptTo(result,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar9));
LAB_001f42bf:
            UnicodeString::~UnicodeString(&local_b0);
            UnicodeString::~UnicodeString(&local_70);
            return UVar3;
          }
          goto LAB_001f4146;
        }
        iVar9 = iVar9 + -1;
        sVar7 = (short)iVar9;
      }
      if (iVar8 == transIdx) {
LAB_001f4146:
        right = this->firstFinalTZTransition;
        if (right == (TimeZoneTransition *)0x0) goto LAB_001f3ff8;
      }
      else {
        right = this->firstTZTransition;
      }
    }
    else {
      if (inclusive == '\0') {
LAB_001f4041:
        UVar11 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
        if (UVar11 <= base) {
          iVar9 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject.
                    _vptr_UObject[9])();
          if ((char)iVar9 != '\0') {
            iVar9 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.
                      super_UObject._vptr_UObject[0xe])
                              (base,this->finalZoneWithStartYear,(ulong)(uint)(int)inclusive,result)
            ;
            return (UBool)iVar9;
          }
          goto LAB_001f3ff8;
        }
        goto LAB_001f4058;
      }
      UVar11 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((UVar11 != base) || (NAN(UVar11) || NAN(base))) goto LAB_001f4041;
      right = this->firstFinalTZTransition;
    }
    TimeZoneTransition::operator=(result,right);
    UVar3 = '\x01';
  }
  else {
LAB_001f3ff8:
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
OlsonTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base >= firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getNextTransition(base, inclusive, result);
                return finalZoneWithStartYear->getNextTransition(base, inclusive, result);
            } else {
                // No more transitions
                return FALSE;
            }
        }
    }
    if (historicRules != NULL) {
        // Find a historical transition
        int16_t transCount = transitionCount();
        int16_t ttidx = transCount - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (!inclusive && base == t)) {
                break;
            }
        }
        if (ttidx == transCount - 1)  {
            if (firstFinalTZTransition != NULL) {
                result = *firstFinalTZTransition;
                return TRUE;
            } else {
                return FALSE;
            }
        } else if (ttidx < firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx + 1]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx]];
            UDate startTime = (UDate)transitionTime(ttidx+1);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getNextTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}